

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
::delete_leaf_node(btree<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
                   *this,node_type *node)

{
  byte bVar1;
  size_type n;
  
  btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
  ::destroy(node,(allocator_type *)node);
  bVar1 = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
          ::max_count(node);
  n = btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>
      ::LeafSize((uint)bVar1);
  Deallocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>>
            (&(this->root_).
              super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
              .
              super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_phmap::priv::btree_node<phmap::priv::set_params<long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_256,_true>_>_*>
              .
              super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<long>,_false>
              ._M_head_impl,node,n);
  return;
}

Assistant:

void delete_leaf_node(node_type *node) {
            node->destroy(mutable_allocator());
            deallocate(node_type::LeafSize(node->max_count()), node);
        }